

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

monst * restore_mon(memfile *mf)

{
  int8_t iVar1;
  uchar uVar2;
  byte bVar3;
  int16_t iVar4;
  int16_t iVar5;
  unsigned_short uVar6;
  uint uVar7;
  int32_t iVar8;
  uint uVar9;
  monst *pmVar10;
  permonst *ppVar11;
  coord *pcVar12;
  coord *pcVar13;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  mfmagic_check(mf,0x4e4f4d);
  iVar4 = mread16(mf);
  iVar5 = mread16(mf);
  pmVar10 = newmonst((int)iVar5,(int)iVar4);
  uVar7 = mread32(mf);
  if (uVar7 == 0xffffec78) {
    pmVar10->data = (permonst *)0x0;
  }
  else {
    if (uVar7 == 0xfffff060) {
      ppVar11 = &upermonst;
    }
    else if (uVar7 == 0xfffff448) {
      ppVar11 = &pm_nemesis;
    }
    else if (uVar7 == 0xfffff830) {
      ppVar11 = &pm_guardian;
    }
    else if (uVar7 == 0xfffffc18) {
      ppVar11 = &pm_leader;
    }
    else {
      if (0x192 < uVar7) {
        panic("Restoring bad monster data.");
      }
      ppVar11 = mons + uVar7;
    }
    pmVar10->data = ppVar11;
  }
  uVar7 = mread32(mf);
  pmVar10->m_id = uVar7;
  iVar8 = mread32(mf);
  pmVar10->mhp = iVar8;
  iVar8 = mread32(mf);
  pmVar10->mhpmax = iVar8;
  iVar8 = mread32(mf);
  pmVar10->mspec_used = iVar8;
  uVar7 = mread32(mf);
  pmVar10->mtrapseen = uVar7;
  uVar7 = mread32(mf);
  pmVar10->mlstmv = uVar7;
  iVar8 = mread32(mf);
  pmVar10->mstrategy = iVar8;
  iVar8 = mread32(mf);
  pmVar10->meating = iVar8;
  mread(mf,pmVar10->mtrack,8);
  iVar4 = mread16(mf);
  pmVar10->mnum = iVar4;
  iVar1 = mread8(mf);
  pmVar10->mx = iVar1;
  iVar1 = mread8(mf);
  pmVar10->my = iVar1;
  iVar1 = mread8(mf);
  pmVar10->mux = iVar1;
  iVar1 = mread8(mf);
  pmVar10->muy = iVar1;
  uVar2 = mread8(mf);
  pmVar10->m_lev = uVar2;
  iVar1 = mread8(mf);
  pmVar10->malign = iVar1;
  iVar4 = mread16(mf);
  pmVar10->movement = iVar4;
  uVar6 = mread16(mf);
  pmVar10->mintrinsics = uVar6;
  iVar1 = mread8(mf);
  pmVar10->mtame = iVar1;
  uVar2 = mread8(mf);
  pmVar10->m_ap_type = uVar2;
  uVar2 = mread8(mf);
  pmVar10->mfrozen = uVar2;
  uVar2 = mread8(mf);
  pmVar10->mblinded = uVar2;
  uVar7 = mread32(mf);
  pmVar10->mappearance = uVar7;
  uVar7 = mread32(mf);
  uVar2 = mread8(mf);
  pmVar10->mfleetim = uVar2;
  iVar1 = mread8(mf);
  pmVar10->weapon_check = iVar1;
  iVar8 = mread32(mf);
  pmVar10->misc_worn_check = iVar8;
  uVar2 = mread8(mf);
  pmVar10->wormno = uVar2;
  iVar1 = mread8(mf);
  pmVar10->minvent = (obj *)(ulong)(iVar1 != '\0');
  iVar1 = mread8(mf);
  pmVar10->mw = (obj *)(ulong)(iVar1 != '\0');
  if (pmVar10->mnamelth != 0) {
    mread(mf,(void *)((long)(pmVar10->mtrack + 0x18) + (long)pmVar10->mxlth),(uint)pmVar10->mnamelth
         );
  }
  switch(pmVar10->mxtyp) {
  case '\x01':
    iVar1 = mread8(mf);
    pmVar10->field_0x74 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x75 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x76 = iVar1;
    iVar1 = mread8(mf);
    pmVar10->field_0x77 = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[1].nmon = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].nmon + 1) = iVar1;
    break;
  case '\x02':
    iVar1 = mread8(mf);
    pmVar10->field_0x74 = iVar1;
    break;
  case '\x03':
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10->field_0x74 = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[1].nmon = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].nmon + 4) = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[1].data = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].data + 4) = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[1].dlevel = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].dlevel + 4) = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[1].minvent = iVar8;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].minvent + 4) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].minvent + 5) = iVar1;
    bVar3 = mread8(mf);
    *(byte *)((long)&pmVar10[1].minvent + 6) =
         *(byte *)((long)&pmVar10[1].minvent + 6) & 0xfe | bVar3 & 1;
    break;
  case '\x04':
    iVar8 = mread32(mf);
    pcVar13 = (coord *)0x0;
    if (iVar8 != -2000) {
      pcVar13 = pmVar10->mtrack + (long)iVar8 * 8 + 0x18;
    }
    pcVar12 = (coord *)0xfffffffffffffc18;
    if (iVar8 != -1000) {
      pcVar12 = pcVar13;
    }
    *(coord **)&pmVar10[0x1b].mnum = pcVar12;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].movement = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].movement + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].mintrinsics = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].mintrinsics + 1) = iVar1;
    iVar8 = mread32(mf);
    pmVar10[0x1b].mtame = (char)iVar8;
    pmVar10[0x1b].m_ap_type = (char)((uint)iVar8 >> 8);
    pmVar10[0x1b].mfrozen = (char)((uint)iVar8 >> 0x10);
    pmVar10[0x1b].mblinded = (char)((uint)iVar8 >> 0x18);
    uVar9 = mread32(mf);
    pmVar10[0x1b].mappearance = uVar9;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[0x1b].field_0x60 = iVar8;
    iVar8 = mread32(mf);
    pmVar10[0x1b].mfleetim = (char)iVar8;
    pmVar10[0x1b].wormno = (char)((uint)iVar8 >> 8);
    pmVar10[0x1b].weapon_check = (char)((uint)iVar8 >> 0x10);
    pmVar10[0x1b].field_0x67 = (char)((uint)iVar8 >> 0x18);
    iVar4 = mread16(mf);
    *(int16_t *)&pmVar10[0x1b].misc_worn_check = iVar4;
    iVar4 = mread16(mf);
    *(int16_t *)((long)&pmVar10[0x1b].misc_worn_check + 2) = iVar4;
    iVar4 = mread16(mf);
    pmVar10[0x1b].mnamelth = (char)iVar4;
    pmVar10[0x1b].mxtyp = (char)((ushort)iVar4 >> 8);
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].mxlth = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].mxlth + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[0x1b].meating = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 2) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[0x1b].meating + 3) = iVar1;
    iVar1 = mread8(mf);
    pmVar10[0x1b].field_0x74 = iVar1;
    mread(mf,&pmVar10[0x1b].field_0x75,0x20);
    mread(mf,(void *)((long)&pmVar10[0x1c].minvent + 5),0x20);
    for (lVar14 = 0x80; lVar14 != 0xd00; lVar14 = lVar14 + 0x10) {
      iVar8 = mread32(mf);
      *(int32_t *)((long)(pmVar10->mtrack + -0x28) + lVar14) = iVar8;
      iVar8 = mread32(mf);
      *(int32_t *)((long)(pmVar10->mtrack + -0x24) + lVar14) = iVar8;
      iVar8 = mread32(mf);
      *(int32_t *)((long)&((monst *)(pmVar10->mtrack + -0x22))->nmon + lVar14) = iVar8;
      iVar1 = mread8(mf);
      *(int8_t *)((long)(pmVar10->mtrack + -0x26) + lVar14) = iVar1;
    }
    break;
  case '\x05':
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10->field_0x74 = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)&pmVar10[1].nmon = iVar8;
    iVar8 = mread32(mf);
    *(int32_t *)((long)&pmVar10[1].nmon + 4) = iVar8;
    iVar1 = mread8(mf);
    *(int8_t *)&pmVar10[1].data = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 1) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 2) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 3) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 4) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 5) = iVar1;
    iVar1 = mread8(mf);
    *(int8_t *)((long)&pmVar10[1].data + 6) = iVar1;
    bVar3 = mread8(mf);
    *(byte *)((long)&pmVar10[1].data + 7) = *(byte *)((long)&pmVar10[1].data + 7) & 0xfe | bVar3 & 1
    ;
    for (lVar14 = 0x8a; lVar14 != 0x1b9; lVar14 = lVar14 + 3) {
      iVar1 = mread8(mf);
      *(int8_t *)((long)(pmVar10->mtrack + -0x23) + lVar14) = iVar1;
      iVar1 = mread8(mf);
      *(int8_t *)((long)pmVar10->mtrack + lVar14 + -0x45) = iVar1;
      iVar1 = mread8(mf);
      *(int8_t *)((long)&((monst *)(pmVar10->mtrack + -0x22))->nmon + lVar14) = iVar1;
    }
  }
  auVar16._4_4_ = uVar7;
  auVar16._0_4_ = uVar7;
  auVar16._8_4_ = uVar7;
  auVar16._12_4_ = uVar7;
  iVar15 = DAT_0029c760._4_4_;
  auVar17._4_4_ = iVar15;
  auVar17._0_4_ = iVar15;
  auVar17._8_4_ = DAT_0029c760._12_4_;
  auVar17._12_4_ = DAT_0029c760._12_4_;
  *(uint *)&pmVar10->field_0x60 =
       (uint)((auVar17._8_8_ & 0xffffffff) * (ulong)uVar7) & 0x80000 | uVar7 * 0x8000 & 0x800000 |
       iVar15 * uVar7 & 0x20000 | uVar7 * 0x800 & 0x200000 |
       (uint)((DAT_0029c760._8_8_ & 0xffffffff) * (ulong)uVar7) & 0x40000 |
       (uint)((auVar16._8_8_ & 0xffffffff) * 0x2000) & 0x400000 |
       (int)DAT_0029c760 * uVar7 & 0x10000 | uVar7 * 0x200 & 0x100000 |
       (uVar7 & 4) << 0x1b | (uVar7 & 8) << 0x19 |
       *(uint *)&pmVar10->field_0x60 & 0xc0000000 | uVar7 >> 0x1f |
       (uVar7 & 0x10) << 0x17 | (uVar7 & 0x20) << 0x15 |
       (uVar7 & 0x40) << 0x13 | (uVar7 & 0x80) << 0x11 |
       uVar7 >> 1 & 0x8000 | uVar7 >> 3 & 0x4000 | uVar7 >> 6 & 0x3000 | uVar7 >> 10 & 0xc00 |
       uVar7 >> 0xd & 0x200 | uVar7 >> 0xf & 0x100 | uVar7 >> 0x11 & 0x80 | uVar7 >> 0x15 & 0x70 |
       uVar7 >> 0x19 & 8 | uVar7 >> 0x1b & 4 | uVar7 >> 0x1d & 2;
  return pmVar10;
}

Assistant:

struct monst *restore_mon(struct memfile *mf)
{
    struct monst *mon;
    short namelen, xtyp;
    int idx, i, billid;
    unsigned int mflags;
    struct eshk *shk;
    
    mfmagic_check(mf, MON_MAGIC);
    
    namelen = mread16(mf);
    xtyp = mread16(mf);
    mon = newmonst(xtyp, namelen);
    
    idx = mread32(mf);
    switch (idx) {
	case -1000: mon->data = &pm_leader; break;
	case -2000: mon->data = &pm_guardian; break;
	case -3000: mon->data = &pm_nemesis; break;
	case -4000: mon->data = &upermonst; break;
	case -5000: mon->data = NULL; break;
	default:
	    if (LOW_PM <= idx && idx < NUMMONS)
		mon->data = &mons[idx];
	    else
		panic("Restoring bad monster data.");
	    break;
    }
    
    mon->m_id = mread32(mf);
    mon->mhp = mread32(mf);
    mon->mhpmax = mread32(mf);
    mon->mspec_used = mread32(mf);
    mon->mtrapseen = mread32(mf);
    mon->mlstmv = mread32(mf);
    mon->mstrategy = mread32(mf);
    mon->meating = mread32(mf);
    mread(mf, mon->mtrack, sizeof(mon->mtrack));
    mon->mnum = mread16(mf);
    mon->mx = mread8(mf);
    mon->my = mread8(mf);
    mon->mux = mread8(mf);
    mon->muy = mread8(mf);
    mon->m_lev = mread8(mf);
    mon->malign = mread8(mf);
    mon->movement = mread16(mf);
    mon->mintrinsics = mread16(mf);
    mon->mtame = mread8(mf);
    mon->m_ap_type = mread8(mf);
    mon->mfrozen = mread8(mf);
    mon->mblinded = mread8(mf);
    mon->mappearance = mread32(mf);
    mflags = mread32(mf);
    
    mon->mfleetim = mread8(mf);
    mon->weapon_check = mread8(mf);
    mon->misc_worn_check = mread32(mf);
    mon->wormno = mread8(mf);
    
    /* just mark the pointers for later restoration */
    mon->minvent = mread8(mf) ? (void*)1 : NULL;
    mon->mw = mread8(mf) ? (void*)1 : NULL;
    
    if (mon->mnamelth)
	mread(mf, NAME(mon), mon->mnamelth);
    
    switch (mon->mxtyp) {
	case MX_EPRI:
	    EPRI(mon)->shralign = mread8(mf);
	    EPRI(mon)->shroom = mread8(mf);
	    EPRI(mon)->shrpos.x = mread8(mf);
	    EPRI(mon)->shrpos.y = mread8(mf);
	    EPRI(mon)->shrlevel.dnum = mread8(mf);
	    EPRI(mon)->shrlevel.dlevel = mread8(mf);
	    break;
	    
	case MX_EMIN:
	    EMIN(mon)->min_align = mread8(mf);
	    break;
	    
	case MX_EDOG:
	    EDOG(mon)->droptime = mread32(mf);
	    EDOG(mon)->dropdist = mread32(mf);
	    EDOG(mon)->apport = mread32(mf);
	    EDOG(mon)->whistletime = mread32(mf);
	    EDOG(mon)->hungrytime = mread32(mf);
	    EDOG(mon)->abuse = mread32(mf);
	    EDOG(mon)->revivals = mread32(mf);
	    EDOG(mon)->mhpmax_penalty = mread32(mf);
	    EDOG(mon)->ogoal.x = mread8(mf);
	    EDOG(mon)->ogoal.y = mread8(mf);
	    EDOG(mon)->killed_by_u = mread8(mf);
	    break;
	    
	case MX_ESHK:
	    shk = ESHK(mon);
	    billid = mread32(mf);
	    shk->bill_p = (billid == -1000) ? (struct bill_x*)-1000 :
			  (billid == -2000) ? NULL : &shk->bill[billid];
	    shk->shk.x = mread8(mf);
	    shk->shk.y = mread8(mf);
	    shk->shd.x = mread8(mf);
	    shk->shd.y = mread8(mf);
	    shk->robbed = mread32(mf);
	    shk->credit = mread32(mf);
	    shk->debit = mread32(mf);
	    shk->loan = mread32(mf);
	    shk->shoptype = mread16(mf);
	    shk->billct = mread16(mf);
	    shk->visitct = mread16(mf);
	    shk->shoplevel.dnum = mread8(mf);
	    shk->shoplevel.dlevel = mread8(mf);
	    shk->shoproom = mread8(mf);
	    shk->following = mread8(mf);
	    shk->surcharge = mread8(mf);
	    shk->cheapskate = mread8(mf);
	    shk->pbanned = mread8(mf);
	    mread(mf, shk->customer, sizeof(shk->customer));
	    mread(mf, shk->shknam, sizeof(shk->shknam));
	    for (i = 0; i < BILLSZ; i++)
		restore_shkbill(mf, &shk->bill[i]);
	    break;
	    
	case MX_EGD:
	    EGD(mon)->fcbeg = mread32(mf);
	    EGD(mon)->fcend = mread32(mf);
	    EGD(mon)->vroom = mread32(mf);
	    EGD(mon)->gdx = mread8(mf);
	    EGD(mon)->gdy = mread8(mf);
	    EGD(mon)->ogx = mread8(mf);
	    EGD(mon)->ogy = mread8(mf);
	    EGD(mon)->gdlevel.dnum = mread8(mf);
	    EGD(mon)->gdlevel.dlevel = mread8(mf);
	    EGD(mon)->warncnt = mread8(mf);
	    EGD(mon)->gddone = mread8(mf);
	    for (i = 0; i < FCSIZ; i++)
		restore_fcorr(mf, &EGD(mon)->fakecorr[i]);
	    break;
    }
    
    mon->female		= (mflags >> 31) & 1;
    mon->minvis		= (mflags >> 30) & 1;
    mon->invis_blkd	= (mflags >> 29) & 1;
    mon->perminvis	= (mflags >> 28) & 1;
    mon->cham		= (mflags >> 25) & 7;
    mon->mundetected	= (mflags >> 24) & 1;
    mon->mcan		= (mflags >> 23) & 1;
    mon->mburied	= (mflags >> 22) & 1;
    mon->mspeed		= (mflags >> 20) & 3;
    mon->permspeed	= (mflags >> 18) & 3;
    mon->mrevived	= (mflags >> 17) & 1;
    mon->mavenge	= (mflags >> 16) & 1;
    mon->mflee		= (mflags >> 15) & 1;
    mon->mcansee	= (mflags >> 14) & 1;
    mon->mcanmove	= (mflags >> 13) & 1;
    mon->msleeping	= (mflags >> 12) & 1;
    mon->mstun		= (mflags >> 11) & 1;
    mon->mconf		= (mflags >> 10) & 1;
    mon->mpeaceful	= (mflags >> 9) & 1;
    mon->mtrapped	= (mflags >> 8) & 1;
    mon->mleashed	= (mflags >> 7) & 1;
    mon->isshk		= (mflags >> 6) & 1;
    mon->isminion	= (mflags >> 5) & 1;
    mon->isgd		= (mflags >> 4) & 1;
    mon->ispriest	= (mflags >> 3) & 1;
    mon->iswiz		= (mflags >> 2) & 1;

    return mon;
}